

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O0

size_t rtc::html_decode(char *buffer,size_t buflen,char *source,size_t srclen)

{
  ostream *poVar1;
  size_t sVar2;
  FatalMessage local_1a8;
  FatalMessageVoidify local_29;
  size_t local_28;
  size_t srclen_local;
  char *source_local;
  size_t buflen_local;
  char *buffer_local;
  
  local_28 = srclen;
  srclen_local = (size_t)source;
  source_local = (char *)buflen;
  buflen_local = (size_t)buffer;
  if (buffer != (char *)0x0) {
    sVar2 = xml_decode(buffer,buflen,source,srclen);
    return sVar2;
  }
  FatalMessageVoidify::FatalMessageVoidify(&local_29);
  FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/stringencode.cc"
             ,0x139);
  poVar1 = FatalMessage::stream(&local_1a8);
  poVar1 = std::operator<<(poVar1,"Check failed: buffer");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"# ");
  FatalMessageVoidify::operator&(&local_29,poVar1);
  FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

size_t html_decode(char * buffer, size_t buflen,
                   const char * source, size_t srclen) {
  RTC_DCHECK(buffer);  // TODO(grunell): estimate output size
  return xml_decode(buffer, buflen, source, srclen);
}